

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall
tchecker::clockbounds::global_lu_map_t::bounds(global_lu_map_t *this,map_t *L,map_t *U)

{
  uint uVar1;
  map_t *U_local;
  map_t *L_local;
  global_lu_map_t *this_local;
  
  uVar1 = array_capacity_t<unsigned_int>::capacity(&L->super_array_capacity_t<unsigned_int>);
  if (uVar1 != this->_clock_nb) {
    __assert_fail("L.capacity() == _clock_nb",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                  ,0x141,
                  "void tchecker::clockbounds::global_lu_map_t::bounds(tchecker::clockbounds::map_t &, tchecker::clockbounds::map_t &) const"
                 );
  }
  uVar1 = array_capacity_t<unsigned_int>::capacity(&U->super_array_capacity_t<unsigned_int>);
  if (uVar1 == this->_clock_nb) {
    clockbounds::clear(L);
    clockbounds::clear(U);
    update(L,this->_L);
    update(U,this->_U);
    return;
  }
  __assert_fail("U.capacity() == _clock_nb",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                ,0x142,
                "void tchecker::clockbounds::global_lu_map_t::bounds(tchecker::clockbounds::map_t &, tchecker::clockbounds::map_t &) const"
               );
}

Assistant:

void global_lu_map_t::bounds(tchecker::clockbounds::map_t & L, tchecker::clockbounds::map_t & U) const
{
  assert(L.capacity() == _clock_nb);
  assert(U.capacity() == _clock_nb);
  tchecker::clockbounds::clear(L);
  tchecker::clockbounds::clear(U);
  tchecker::clockbounds::update(L, *_L);
  tchecker::clockbounds::update(U, *_U);
}